

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O0

void Diligent::anon_unknown_65::TransitionAccelStruct<false>
               (DeviceContextVkImpl *pCtxVkImpl,TopLevelASVkImpl *pTLASVk,DescriptorType DescrType)

{
  bool bVar1;
  RESOURCE_STATE RVar2;
  Char *Message;
  char (*in_RCX) [58];
  bool IsInRequiredState;
  undefined1 local_40 [8];
  string msg;
  RESOURCE_STATE RequiredState;
  DescriptorType DescrType_local;
  TopLevelASVkImpl *pTLASVk_local;
  DeviceContextVkImpl *pCtxVkImpl_local;
  
  if ((pTLASVk != (TopLevelASVkImpl *)0x0) &&
     (msg.field_2._M_local_buf[0xf] = DescrType,
     bVar1 = TopLevelASBase<Diligent::EngineVkImplTraits>::IsInKnownState
                       (&pTLASVk->super_TopLevelASBase<Diligent::EngineVkImplTraits>), bVar1)) {
    msg.field_2._8_4_ = 0x80000;
    RVar2 = DescriptorTypeToResourceState(msg.field_2._M_local_buf[0xf]);
    if (RVar2 != RESOURCE_STATE_RAY_TRACING) {
      FormatString<char[26],char[58]>
                ((string *)local_40,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DescriptorTypeToResourceState(DescrType) == RequiredState",in_RCX);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"TransitionAccelStruct",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0x26e);
      std::__cxx11::string::~string((string *)local_40);
    }
    bVar1 = TopLevelASBase<Diligent::EngineVkImplTraits>::CheckState
                      (&pTLASVk->super_TopLevelASBase<Diligent::EngineVkImplTraits>,
                       RESOURCE_STATE_RAY_TRACING);
    if (!bVar1) {
      DeviceContextVkImpl::TransitionTLASState
                (pCtxVkImpl,pTLASVk,RESOURCE_STATE_UNKNOWN,RESOURCE_STATE_RAY_TRACING,true);
    }
    TopLevelASBase<Diligent::EngineVkImplTraits>::ValidateContent
              (&pTLASVk->super_TopLevelASBase<Diligent::EngineVkImplTraits>);
  }
  return;
}

Assistant:

inline void TransitionAccelStruct(DeviceContextVkImpl* pCtxVkImpl,
                                  TopLevelASVkImpl*    pTLASVk,
                                  DescriptorType       DescrType)
{
    if (pTLASVk == nullptr || !pTLASVk->IsInKnownState())
        return;

    constexpr RESOURCE_STATE RequiredState = RESOURCE_STATE_RAY_TRACING;
    VERIFY_EXPR(DescriptorTypeToResourceState(DescrType) == RequiredState);
    const bool IsInRequiredState = pTLASVk->CheckState(RequiredState);
    if (VerifyOnly)
    {
        if (!IsInRequiredState)
        {
            LOG_ERROR_MESSAGE("State of TLAS '", pTLASVk->GetDesc().Name, "' is incorrect. Required state: ",
                              GetResourceStateString(RequiredState), ". Actual state: ",
                              GetResourceStateString(pTLASVk->GetState()),
                              ". Call IDeviceContext::TransitionShaderResources(), use RESOURCE_STATE_TRANSITION_MODE_TRANSITION "
                              "when calling IDeviceContext::CommitShaderResources() or explicitly transition the TLAS state "
                              "with IDeviceContext::TransitionResourceStates().");
        }
    }
    else
    {
        if (!IsInRequiredState)
        {
            pCtxVkImpl->TransitionTLASState(*pTLASVk, RESOURCE_STATE_UNKNOWN, RequiredState, true);
        }
    }

#ifdef DILIGENT_DEVELOPMENT
    pTLASVk->ValidateContent();
#endif
}